

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  cmValue value;
  uint uVar5;
  string *f2;
  bool bVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string dep_newest;
  int result_2;
  string out_oldest;
  int result_1;
  undefined4 uStack_2bc4;
  cmList outputs;
  cmList depends;
  cmList products;
  ostringstream msg_1;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  
  bVar1 = isCMakeVerbose();
  if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
    if (!bVar1) {
      return 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mf,"Re-run cmake no build system arguments\n",(allocator<char> *)&msg_1);
    cmSystemTools::Stdout((string *)&mf);
    std::__cxx11::string::~string((string *)&mf);
    return 1;
  }
  psVar4 = &this->CheckBuildSystemArgument;
  bVar2 = cmsys::SystemTools::FileExists(psVar4);
  if (!bVar2) {
    if (!bVar1) {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&mf);
    poVar3 = std::operator<<((ostream *)&mf,"Re-run cmake missing file: ");
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)&msg_1);
    std::__cxx11::string::~string((string *)&msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mf);
    return 1;
  }
  uVar5 = 1;
  cmake(&cm,RoleScript,Unknown,Normal);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&msg_1);
  SetHomeDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&msg_1);
  SetHomeOutputDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  _msg_1 = cm.CurrentSnapshot.State;
  cmMakefile::cmMakefile(&mf,&gg,(cmStateSnapshot *)&msg_1);
  bVar2 = cmMakefile::ReadListFile(&mf,psVar4);
  if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccurredFlag(), bVar2)) {
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_1);
      poVar3 = std::operator<<((ostream *)&msg_1,"Re-run cmake error reading : ");
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,'\n');
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout(&dep_newest);
      std::__cxx11::string::~string((string *)&dep_newest);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_1);
    }
    goto LAB_00367b9f;
  }
  if (this->ClearBuildSystem == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg_1,"CMAKE_DEPENDS_GENERATOR",(allocator<char> *)&out_oldest);
    psVar4 = cmMakefile::GetSafeDefinition(&mf,(string *)&msg_1);
    std::__cxx11::string::string((string *)&dep_newest,(string *)psVar4);
    std::__cxx11::string::~string((string *)&msg_1);
    if (dep_newest._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&dep_newest);
    }
    CreateGlobalGenerator((cmake *)&result_1,(string *)this,SUB81(&dep_newest,0));
    if (CONCAT44(uStack_2bc4,result_1) != 0) {
      _msg_1 = cm.CurrentSnapshot.State;
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&msg_1);
      out_oldest.field_2._M_allocated_capacity = cm.CurrentSnapshot.Position.Position;
      out_oldest._M_dataplus._M_p = (pointer)cm.CurrentSnapshot.State;
      out_oldest._M_string_length = (size_type)cm.CurrentSnapshot.Position.Tree;
      cmMakefile::cmMakefile
                ((cmMakefile *)&msg_1,(cmGlobalGenerator *)CONCAT44(uStack_2bc4,result_1),
                 (cmStateSnapshot *)&out_oldest);
      (**(code **)(*(long *)CONCAT44(uStack_2bc4,result_1) + 0x10))
                (&out_oldest,(long *)CONCAT44(uStack_2bc4,result_1),&msg_1);
      (**(code **)(*(long *)out_oldest._M_dataplus._M_p + 0x60))
                (out_oldest._M_dataplus._M_p,&msg_1,bVar1);
      if (out_oldest._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)out_oldest._M_dataplus._M_p + 8))();
      }
      cmMakefile::~cmMakefile((cmMakefile *)&msg_1);
      if ((long *)CONCAT44(uStack_2bc4,result_1) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(uStack_2bc4,result_1) + 8))();
      }
    }
    std::__cxx11::string::~string((string *)&dep_newest);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dep_newest,"CMAKE_MAKEFILE_PRODUCTS",(allocator<char> *)&out_oldest);
  psVar4 = (string *)cmMakefile::GetDefinition(&mf,&dep_newest);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&msg_1,(string *)psVar4);
  init._M_len = 1;
  init._M_array = (iterator)&msg_1;
  cmList::cmList(&products,init);
  std::__cxx11::string::~string((string *)&msg_1);
  std::__cxx11::string::~string((string *)&dep_newest);
  for (; products.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         products.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      products.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           products.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    bVar2 = cmsys::SystemTools::PathExists
                      (products.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (!bVar2) {
      uVar5 = 1;
      if (bVar1) {
        dep_newest._M_dataplus._M_p._0_1_ = 10;
        cmStrCat<char_const(&)[34],std::__cxx11::string_const&,char>
                  ((string *)&msg_1,(char (*) [34])"Re-run cmake, missing byproduct: ",
                   products.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(char *)&dep_newest);
        cmSystemTools::Stdout((string *)&msg_1);
        std::__cxx11::string::~string((string *)&msg_1);
      }
      goto LAB_00367b92;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dep_newest,"CMAKE_MAKEFILE_DEPENDS",(allocator<char> *)&out_oldest);
  psVar4 = (string *)cmMakefile::GetDefinition(&mf,&dep_newest);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&msg_1,(string *)psVar4);
  init_00._M_len = 1;
  init_00._M_array = (iterator)&msg_1;
  cmList::cmList(&depends,init_00);
  std::__cxx11::string::~string((string *)&msg_1);
  std::__cxx11::string::~string((string *)&dep_newest);
  outputs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (depends.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      depends.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0036798a:
    uVar5 = 1;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg_1,
                 "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n",
                 (allocator<char> *)&dep_newest);
      cmSystemTools::Stdout((string *)&msg_1);
      psVar4 = (string *)&msg_1;
      goto LAB_00367b76;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg_1,"CMAKE_MAKEFILE_OUTPUTS",(allocator<char> *)&dep_newest);
    value = cmMakefile::GetDefinition(&mf,(string *)&msg_1);
    uVar5 = 1;
    cmList::assign(&outputs,value,Yes,No);
    std::__cxx11::string::~string((string *)&msg_1);
    if ((depends.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         depends.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (outputs.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        outputs.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0036798a;
    std::__cxx11::string::string
              ((string *)&dep_newest,
               (string *)
               depends.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    psVar4 = depends.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (f2 = outputs.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start, psVar4 = psVar4 + 1,
          psVar4 != depends.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      out_oldest._M_dataplus._M_p = out_oldest._M_dataplus._M_p & 0xffffffff00000000;
      bVar2 = cmFileTimeCache::Compare
                        ((this->FileTimeCache)._M_t.
                         super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                         .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,&dep_newest,
                         psVar4,(int *)&out_oldest);
      if (!bVar2) {
        if (!bVar1) goto LAB_00367b71;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg_1,"Re-run cmake: build system dependency is missing\n",
                   (allocator<char> *)&result_1);
        cmSystemTools::Stdout((string *)&msg_1);
        psVar4 = (string *)&msg_1;
        goto LAB_00367b6c;
      }
      if ((int)out_oldest._M_dataplus._M_p < 0) {
        std::__cxx11::string::_M_assign((string *)&dep_newest);
      }
    }
    std::__cxx11::string::string
              ((string *)&out_oldest,
               (string *)
               outputs.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    while (f2 = f2 + 1,
          f2 != outputs.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
      result_1 = 0;
      bVar2 = cmFileTimeCache::Compare
                        ((this->FileTimeCache)._M_t.
                         super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                         .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,&out_oldest,
                         f2,&result_1);
      if (!bVar2) {
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg_1,"Re-run cmake: build system output is missing\n",
                     (allocator<char> *)&result_2);
          cmSystemTools::Stdout((string *)&msg_1);
          std::__cxx11::string::~string((string *)&msg_1);
        }
        uVar5 = 1;
        goto LAB_00367b67;
      }
      if (0 < result_1) {
        std::__cxx11::string::_M_assign((string *)&out_oldest);
      }
    }
    result_2 = 0;
    bVar2 = cmFileTimeCache::Compare
                      ((this->FileTimeCache)._M_t.
                       super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>
                       .super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl,&out_oldest,
                       &dep_newest,&result_2);
    bVar6 = result_2 < 0;
    if (bVar1 && (!bVar2 || bVar6)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_1);
      poVar3 = std::operator<<((ostream *)&msg_1,"Re-run cmake file: ");
      poVar3 = std::operator<<(poVar3,(string *)&out_oldest);
      poVar3 = std::operator<<(poVar3," older than: ");
      poVar3 = std::operator<<(poVar3,(string *)&dep_newest);
      std::operator<<(poVar3,'\n');
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((string *)&result_1);
      std::__cxx11::string::~string((string *)&result_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_1);
    }
    uVar5 = (uint)(!bVar2 || bVar6);
LAB_00367b67:
    psVar4 = &out_oldest;
LAB_00367b6c:
    std::__cxx11::string::~string((string *)psVar4);
LAB_00367b71:
    psVar4 = &dep_newest;
LAB_00367b76:
    std::__cxx11::string::~string((string *)psVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs.Values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends.Values);
LAB_00367b92:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&products.Values);
LAB_00367b9f:
  cmMakefile::~cmMakefile(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  ~cmake(&cm);
  return uVar5;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.
  const bool verbose = isCMakeVerbose();

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if (this->CheckBuildSystemArgument.empty()) {
    if (verbose) {
      cmSystemTools::Stdout("Re-run cmake no build system arguments\n");
    }
    return 1;
  }

  // If the file provided does not exist, we have to rerun.
  if (!cmSystemTools::FileExists(this->CheckBuildSystemArgument)) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: " << this->CheckBuildSystemArgument
          << '\n';
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  // Actually, all we need is the `set` command.
  cmake cm(RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!mf.ReadListFile(this->CheckBuildSystemArgument) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : " << this->CheckBuildSystemArgument
          << '\n';
      cmSystemTools::Stdout(msg.str());
    }
    // There was an error reading the file.  Just rerun.
    return 1;
  }

  if (this->ClearBuildSystem) {
    // Get the generator used for this build system.
    std::string genName = mf.GetSafeDefinition("CMAKE_DEPENDS_GENERATOR");
    if (!cmNonempty(genName)) {
      genName = "Unix Makefiles";
    }

    // Create the generator and use it to clear the dependencies.
    std::unique_ptr<cmGlobalGenerator> ggd =
      this->CreateGlobalGenerator(genName);
    if (ggd) {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmMakefile mfd(ggd.get(), cm.GetCurrentSnapshot());
      auto lgd = ggd->CreateLocalGenerator(&mfd);
      lgd->ClearDependencies(&mfd, verbose);
    }
  }

  // If any byproduct of makefile generation is missing we must re-run.
  cmList products{ mf.GetDefinition("CMAKE_MAKEFILE_PRODUCTS") };
  for (auto const& p : products) {
    if (!cmSystemTools::PathExists(p)) {
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Re-run cmake, missing byproduct: ", p, '\n'));
      }
      return 1;
    }
  }

  // Get the set of dependencies and outputs.
  cmList depends{ mf.GetDefinition("CMAKE_MAKEFILE_DEPENDS") };
  cmList outputs;
  if (!depends.empty()) {
    outputs.assign(mf.GetDefinition("CMAKE_MAKEFILE_OUTPUTS"));
  }
  if (depends.empty() || outputs.empty()) {
    // Not enough information was provided to do the test.  Just rerun.
    if (verbose) {
      cmSystemTools::Stdout("Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
                            "or CMAKE_MAKEFILE_OUTPUTS :\n");
    }
    return 1;
  }

  // Find the newest dependency.
  auto dep = depends.begin();
  std::string dep_newest = *dep++;
  for (; dep != depends.end(); ++dep) {
    int result = 0;
    if (this->FileTimeCache->Compare(dep_newest, *dep, &result)) {
      if (result < 0) {
        dep_newest = *dep;
      }
    } else {
      if (verbose) {
        cmSystemTools::Stdout(
          "Re-run cmake: build system dependency is missing\n");
      }
      return 1;
    }
  }

  // Find the oldest output.
  auto out = outputs.begin();
  std::string out_oldest = *out++;
  for (; out != outputs.end(); ++out) {
    int result = 0;
    if (this->FileTimeCache->Compare(out_oldest, *out, &result)) {
      if (result > 0) {
        out_oldest = *out;
      }
    } else {
      if (verbose) {
        cmSystemTools::Stdout(
          "Re-run cmake: build system output is missing\n");
      }
      return 1;
    }
  }

  // If any output is older than any dependency then rerun.
  {
    int result = 0;
    if (!this->FileTimeCache->Compare(out_oldest, dep_newest, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake file: " << out_oldest
            << " older than: " << dep_newest << '\n';
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // No need to rerun.
  return 0;
}